

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

void __thiscall MTRand::seed(MTRand *this,uint32 *bigSeed,uint32 seedLength)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  initialize(this,0x12bd6aa);
  uVar3 = 0x270;
  if (0x270 < seedLength) {
    uVar3 = seedLength;
  }
  iVar1 = 1;
  uVar4 = 0;
  while (iVar2 = (int)uVar3, uVar3 = (ulong)(iVar2 - 1), iVar2 != 0) {
    uVar5 = (this->state[(long)iVar1 + -1] >> 0x1e ^ this->state[(long)iVar1 + -1]) * 0x19660d ^
            this->state[iVar1];
    this->state[iVar1] = uVar5;
    this->state[iVar1] = (ulong)(uint)((int)uVar5 + (int)bigSeed[uVar4] + (int)uVar4);
    if (iVar1 < 0x26f) {
      iVar1 = iVar1 + 1;
    }
    else {
      this->state[0] = this->state[0x26f];
      iVar1 = 1;
    }
    uVar4 = uVar4 + 1;
    if (seedLength <= uVar4) {
      uVar4 = 0;
    }
  }
  for (iVar2 = -0x26f; iVar2 != 0; iVar2 = iVar2 + 1) {
    this->state[iVar1] =
         (ulong)((((uint)(this->state[(long)iVar1 + -1] >> 0x1e) ^
                  (uint)this->state[(long)iVar1 + -1]) * 0x5d588b65 ^ (uint)this->state[iVar1]) -
                iVar1);
    if (iVar1 < 0x26f) {
      iVar1 = iVar1 + 1;
    }
    else {
      this->state[0] = this->state[0x26f];
      iVar1 = 1;
    }
  }
  this->state[0] = 0x80000000;
  reload(this);
  return;
}

Assistant:

void MTRand::seed(uint32 *const bigSeed, const uint32 seedLength) {
  // Seed the generator with an array of uint32's
  // There are 2^19937-1 possible initial states.  This function allows
  // all of those to be accessed by providing at least 19937 bits (with a
  // default seed length of N = 624 uint32's).  Any bits above the lower 32
  // in each element are discarded.
  // Just call seed() if you want to get array from /dev/urandom
  initialize(19650218UL);
  int i = 1;
  uint32 j = 0;
  int k = (uint32(N) > seedLength ? int(N) : int(seedLength));
  for (; k; --k) {
    state[i] = state[i] ^ ((state[i - 1] ^ (state[i - 1] >> 30)) * 1664525UL);
    state[i] += (bigSeed[j] & 0xffffffffUL) + j;
    state[i] &= 0xffffffffUL;
    ++i;
    ++j;
    if (i >= N) {
      state[0] = state[N - 1];
      i = 1;
    }
    if (j >= seedLength)
      j = 0;
  }
  for (k = N - 1; k; --k) {
    state[i] =
        state[i] ^ ((state[i - 1] ^ (state[i - 1] >> 30)) * 1566083941UL);
    state[i] -= i;
    state[i] &= 0xffffffffUL;
    ++i;
    if (i >= N) {
      state[0] = state[N - 1];
      i = 1;
    }
  }
  state[0] = 0x80000000UL; // MSB is 1, assuring non-zero initial array
  reload();
}